

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare.cc
# Opt level: O2

void __thiscall re2c::DFA::calc_stats(DFA *this)

{
  State *pSVar1;
  ulong uVar2;
  pointer ppSVar3;
  pointer ppSVar4;
  State **ppSVar5;
  ulong uVar6;
  State **ppSVar7;
  
  this->max_fill = 0;
  uVar6 = 0;
  ppSVar5 = &this->head;
  ppSVar7 = ppSVar5;
  while (pSVar1 = *ppSVar7, pSVar1 != (State *)0x0) {
    uVar2 = pSVar1->fill;
    if (uVar6 < uVar2) {
      this->max_fill = uVar2;
      uVar6 = uVar2;
    }
    ppSVar7 = &pSVar1->next;
  }
  ppSVar3 = (this->accepts).elems.
            super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppSVar4 = (this->accepts).elems.
            super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this->need_backup = ppSVar3 != ppSVar4;
  while (pSVar1 = *ppSVar5, pSVar1 != (State *)0x0) {
    if (pSVar1->isPreCtxt == true) {
      this->need_backupctx = true;
    }
    ppSVar5 = &pSVar1->next;
  }
  this->need_accept = 8 < (ulong)((long)ppSVar3 - (long)ppSVar4);
  return;
}

Assistant:

void DFA::calc_stats ()
{
	// calculate 'YYMAXFILL'
	max_fill = 0;
	for (State * s = head; s; s = s->next)
	{
		if (max_fill < s->fill)
		{
			max_fill = s->fill;
		}
	}

	// determine if 'YYMARKER' or 'YYBACKUP'/'YYRESTORE' pair is used
	need_backup = accepts.size () > 0;

	// determine if 'YYCTXMARKER' or 'YYBACKUPCTX'/'YYRESTORECTX' pair is used
	for (State * s = head; s; s = s->next)
	{
		if (s->isPreCtxt)
		{
			need_backupctx = true;
		}
	}

	// determine if 'yyaccept' variable is used
	need_accept = accepts.size () > 1;
}